

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::utils::Generator::calcMinSeparation
          (ChVector<double> *__return_storage_ptr__,Generator *this,ChVector<double> *sep)

{
  double dVar1;
  undefined1 auVar2 [16];
  pointer psVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 extraout_var [56];
  
  auVar2 = *(undefined1 (*) [16])sep->m_data;
  psVar3 = (this->m_mixture).
           super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar8 = ZEXT816(0) << 0x40;
  lVar4 = (long)(this->m_mixture).
                super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4;
  dVar1 = sep->m_data[2];
  auVar6 = ZEXT816(0);
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    auVar7._0_8_ = MixtureIngredient::calcMinSeparation
                             ((psVar3->
                              super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
    auVar7._8_56_ = extraout_var;
    auVar8._8_8_ = auVar7._0_8_;
    auVar8._0_8_ = auVar7._0_8_;
    auVar8 = vmaxpd_avx(auVar8,auVar2);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar1;
    auVar6 = vmaxsd_avx(auVar7._0_16_,auVar6);
    psVar3 = psVar3 + 1;
  }
  __return_storage_ptr__->m_data[2] = auVar6._0_8_;
  *(undefined1 (*) [16])__return_storage_ptr__->m_data = auVar8;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> Generator::calcMinSeparation(const ChVector<>& sep) {
    ChVector<> res;

    for (int i = 0; i < m_mixture.size(); i++) {
        double mix_sep = m_mixture[i]->calcMinSeparation();
        res.x() = std::max(sep.x(), mix_sep);
        res.y() = std::max(sep.y(), mix_sep);
        res.z() = std::max(sep.z(), mix_sep);
    }

    return res;
}